

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O2

void encode_pure(char *digits,uint digits_size,uint width,int value,char *result)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  char acStack_19 [9];
  char buf [16];
  
  uVar2 = (ulong)(uint)-value;
  if (0 < value) {
    uVar2 = (ulong)(uint)value;
  }
  uVar4 = 1;
  do {
    uVar3 = uVar4;
    uVar1 = (uint)uVar2;
    acStack_19[(ulong)(uVar3 - 1) + 1] = digits[uVar2 % (ulong)digits_size];
    uVar4 = uVar3 + 1;
    uVar2 = uVar2 / digits_size;
  } while (digits_size <= uVar1);
  uVar1 = uVar3;
  if (value < 0) {
    acStack_19[(ulong)uVar3 + 1] = '-';
    uVar3 = uVar4;
    uVar1 = uVar4;
  }
  for (; uVar3 < width; uVar3 = uVar3 + 1) {
    *result = ' ';
    result = result + 1;
  }
  uVar2 = (ulong)uVar1;
  while (uVar2 != 0) {
    *result = acStack_19[uVar2];
    result = result + 1;
    uVar2 = uVar2 - 1;
  }
  *result = '\0';
  return;
}

Assistant:

static
void
encode_pure(
  const char* digits,
  unsigned digits_size,
  unsigned width,
  int value,
  char* result)
{
  char buf[16];
  int rest;
  unsigned i, j;
  i = 0;
  j = 0;
  if (value < 0) {
    j = 1;
    value = -value;
  }
  while (1) {
    rest = value / digits_size;
    buf[i++] = digits[value - rest * digits_size];
    if (rest == 0) break;
    value = rest;
  }
  if (j) buf[i++] = '-';
  for(j=i;j<width;j++) *result++ = ' ';
  while (i != 0) *result++ = buf[--i];
  *result = '\0';
}